

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemUtils.cpp
# Opt level: O1

void ApprovalTests::SystemUtils::runSystemCommandOrThrow(string *command,bool allowNonZeroExitCodes)

{
  int __val;
  runtime_error *this;
  string sStack_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  __val = system((command->_M_dataplus)._M_p);
  if (__val == 0 || allowNonZeroExitCodes) {
    return;
  }
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  ::std::operator+(&local_58,command,": failed with exit code ");
  ::std::__cxx11::to_string(&sStack_78,__val);
  ::std::operator+(&local_38,&local_58,&sStack_78);
  ::std::runtime_error::runtime_error(this,(string *)&local_38);
  __cxa_throw(this,&::std::runtime_error::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

void SystemUtils::runSystemCommandOrThrow(const std::string& command,
                                              bool allowNonZeroExitCodes)
    {
        int exitCode = system(command.c_str());

        if (!allowNonZeroExitCodes && exitCode != 0)
        {
            throw std::runtime_error(command + ": failed with exit code " +
                                     std::to_string(exitCode));
        }
    }